

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers
          (ConversionStream *this,iterator *Token,SamplerHashType *SamplersHash)

{
  TokenListType *pTVar1;
  int iVar2;
  _List_node_base *p_Var3;
  uint uVar4;
  string *in_R8;
  int iVar5;
  string msg;
  int local_98;
  string local_90;
  undefined1 local_70;
  ConversionStream *local_68;
  String local_60;
  _List_node_base **local_40;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_38;
  
  p_Var3 = Token->_M_node;
  iVar5 = *(int *)&p_Var3[1]._M_next;
  local_68 = this;
  local_38 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)SamplersHash;
  if (((iVar5 != 0x133) && (iVar5 != 0x135)) &&
     (p_Var3 != (this->m_Tokens).
                super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ._M_impl._M_node.super__List_node_base._M_next)) {
    FormatString<char[26],char[104]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin()"
               ,(char (*) [104])this);
    DebugAssertionFailed
              (local_90._M_dataplus._M_p,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x4b2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    p_Var3 = Token->_M_node;
    iVar5 = *(int *)&p_Var3[1]._M_next;
  }
  p_Var3 = p_Var3->_M_next;
  Token->_M_node = p_Var3;
  pTVar1 = &local_68->m_Tokens;
  if (p_Var3 != (_List_node_base *)pTVar1) {
    local_98 = 1;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      switch(iVar2) {
      case 0x133:
      case 0x135:
        local_98 = local_98 + 1;
        break;
      case 0x134:
      case 0x136:
        local_98 = local_98 + -1;
        if (local_98 == 0) {
          return;
        }
        break;
      default:
        if (iVar2 != 0x10d) {
          if (local_98 == 1 && iVar2 == 0x10e) goto LAB_001ee965;
          break;
        }
        if (local_98 != 1) break;
LAB_001ee965:
        local_40 = &p_Var3[1]._M_prev;
        p_Var3 = p_Var3->_M_next;
        Token->_M_node = p_Var3;
        do {
          if (p_Var3 == (_List_node_base *)pTVar1) {
            FormatString<char[19],std::__cxx11::string,char[13]>
                      (&local_90,(Diligent *)"Unexpected EOF in ",(char (*) [19])local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34a280
                       ,(char (*) [13])in_R8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_60,local_68,Token,4);
            in_R8 = &local_90;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ParseSamplers",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x4dd,&local_90,(char (*) [2])0x341003,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            p_Var3 = Token->_M_node;
          }
          if (*(int *)&p_Var3[1]._M_next != 0x13b) {
            FormatString<char[23],std::__cxx11::string,char[13]>
                      (&local_90,(Diligent *)"Missing identifier in ",(char (*) [23])local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34a280
                       ,(char (*) [13])in_R8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_60,local_68,Token,4);
            in_R8 = &local_90;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ParseSamplers",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x4de,&local_90,(char (*) [2])0x341003,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            p_Var3 = Token->_M_node;
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,p_Var3[1]._M_prev,
                     (long)&(p_Var3[1]._M_prev)->_M_next + (long)p_Var3[2]._M_next);
          local_70 = iVar2 == 0x10e;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,bool>>(local_38,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          p_Var3 = Token->_M_node->_M_next;
          Token->_M_node = p_Var3;
          if (iVar5 == 0x135) break;
          while (p_Var3 != (_List_node_base *)pTVar1) {
            uVar4 = *(uint *)&p_Var3[1]._M_next;
            if ((uVar4 & 0xfffffffe) == 0x13e) goto LAB_001eebd7;
            p_Var3 = p_Var3->_M_next;
            Token->_M_node = p_Var3;
          }
          FormatString<char[30],std::__cxx11::string,char[13]>
                    (&local_90,(Diligent *)"Unexpected EOF while parsing ",(char (*) [30])local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34a280,
                     (char (*) [13])in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_60,local_68,Token,4);
          in_R8 = &local_90;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseSamplers",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x4f8,&local_90,(char (*) [2])0x341003,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          p_Var3 = Token->_M_node;
          uVar4 = *(uint *)&p_Var3[1]._M_next;
LAB_001eebd7:
          if (uVar4 != 0x13f) break;
          p_Var3 = p_Var3->_M_next;
          Token->_M_node = p_Var3;
        } while (p_Var3 != (_List_node_base *)pTVar1);
        goto LAB_001eebf6;
      }
      p_Var3 = p_Var3->_M_next;
      Token->_M_node = p_Var3;
LAB_001eebf6:
    } while ((p_Var3 != (_List_node_base *)pTVar1) && (local_98 != 0));
    if ((local_98 != 0) && ((local_98 != 1 || (p_Var3 != (_List_node_base *)pTVar1)))) {
      FormatString<char[20]>(&local_90,(char (*) [20])"Error parsing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,local_68,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseSamplers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x50d,&local_90,(char (*) [2])0x341003,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers(TokenListType::iterator& Token, SamplerHashType& SamplersHash)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin());
    Uint32 ScopeDepth             = 1;
    bool   IsFunctionArgumentList = Token->Type == TokenType::OpenParen;

    // Skip scope start symbol, which is either open bracket or m_Tokens.begin()
    ++Token;
    while (Token != m_Tokens.end() && ScopeDepth > 0)
    {
        if (Token->Type == TokenType::OpenParen ||
            Token->Type == TokenType::OpenBrace)
        {
            // Increase scope depth
            ++ScopeDepth;
            ++Token;
        }
        else if (Token->Type == TokenType::ClosingParen ||
                 Token->Type == TokenType::ClosingBrace)
        {
            // Decrease scope depth
            --ScopeDepth;
            if (ScopeDepth == 0)
                break;
            ++Token;
        }
        else if ((Token->Type == TokenType::kw_SamplerState ||
                  Token->Type == TokenType::kw_SamplerComparisonState) &&
                 // ONLY parse sampler states in the current scope, skip
                 // all nested scopes
                 ScopeDepth == 1)
        {
            const auto& SamplerType   = Token->Literal;
            bool        bIsComparison = Token->Type == TokenType::kw_SamplerComparisonState;
            // SamplerState LinearClamp;
            // ^
            ++Token;

            // There may be a number of samplers declared after single
            // Sampler[Comparison]State keyword:
            // SamplerState Tex2D1_sampler, Tex2D2_sampler;
            do
            {
                // SamplerState LinearClamp;
                //              ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", SamplerType, " declaration");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing identifier in ", SamplerType, " declaration");
                const auto& SamplerName = Token->Literal;

                // Add sampler state into the hash map
                SamplersHash.insert(std::make_pair(SamplerName, bIsComparison));

                ++Token;
                // SamplerState LinearClamp ;
                //                          ^

                // We cannot just remove sampler declarations, because samplers can
                // be passed to functions as arguments.
                // SamplerState and SamplerComparisonState are #defined as int, so all
                // sampler variables will just be unused global variables or function parameters.
                // Hopefully GLSL compiler will be able to optimize them out.

                if (IsFunctionArgumentList)
                {
                    // In function argument list, every argument
                    // has its own type declaration
                    break;
                }

                // Go to the next sampler declaration or statement end
                while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    ++Token;
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing ", SamplerType, " declaration");

                if (Token->Type == TokenType::Comma)
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                            ^
                    ++Token;
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                              ^
                }
                else
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                                             ^
                    break;
                }
            } while (Token != m_Tokens.end());
        }
        else
            ++Token;
    }
    VERIFY_PARSER_STATE(Token, (ScopeDepth == 1 && Token == m_Tokens.end()) || ScopeDepth == 0, "Error parsing scope");
}